

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

uint32_t gravity_fiber_size(gravity_vm *vm,gravity_fiber_t *fiber)

{
  gravity_object_t *obj;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  gravity_value_t *pgVar4;
  int iVar5;
  gravity_value_t *pgVar6;
  
  (fiber->gc).visited = true;
  iVar5 = fiber->stackalloc * 0x10 + fiber->framesalloc * 0x30 + 0xa8;
  pgVar4 = fiber->stacktop;
  for (pgVar6 = fiber->stack; pgVar6 < pgVar4; pgVar6 = pgVar6 + 1) {
    obj = (pgVar6->field_1).p;
    _Var1 = gravity_value_isobject(*pgVar6);
    uVar2 = 0;
    if (_Var1) {
      uVar2 = gravity_object_size(vm,obj);
      pgVar4 = fiber->stacktop;
    }
    iVar5 = iVar5 + uVar2;
  }
  uVar2 = string_size(fiber->error);
  uVar3 = gravity_object_size(vm,(gravity_object_t *)fiber->caller);
  (fiber->gc).visited = false;
  return uVar3 + uVar2 + iVar5;
}

Assistant:

uint32_t gravity_fiber_size (gravity_vm *vm, gravity_fiber_t *fiber) {
    SET_OBJECT_VISITED_FLAG(fiber, true);
    
    // internal size
    uint32_t fiber_size = sizeof(gravity_fiber_t);
    fiber_size += fiber->stackalloc * sizeof(gravity_value_t);
    fiber_size += fiber->framesalloc * sizeof(gravity_callframe_t);

    // stack size
    for (gravity_value_t* slot = fiber->stack; slot < fiber->stacktop; ++slot) {
        fiber_size += gravity_value_size(vm, *slot);
    }

    fiber_size += string_size(fiber->error);
    fiber_size += gravity_object_size(vm, (gravity_object_t *)fiber->caller);

    SET_OBJECT_VISITED_FLAG(fiber, false);
    return fiber_size;
}